

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afhints.c
# Opt level: O3

FT_Error af_axis_hints_new_edge
                   (AF_AxisHints axis,FT_Int fpos,AF_Direction dir,FT_Bool top_to_bottom_hinting,
                   FT_Memory memory,AF_Edge_conflict *anedge)

{
  uint uVar1;
  undefined6 uVar2;
  FT_UInt FVar3;
  uint uVar4;
  AF_Edge_conflict pAVar5;
  AF_Edge_conflict pAVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  AF_Edge_conflict pAVar10;
  AF_Edge_conflict pAVar11;
  byte bVar12;
  FT_Error error;
  FT_Error local_40;
  uint local_3c;
  AF_EdgeRec *local_38;
  
  bVar12 = 0;
  local_40 = 0;
  uVar8 = (ulong)axis->num_edges;
  if (uVar8 < 0xc) {
    if (axis->edges == (AF_Edge_conflict)0x0) {
      axis->edges = (axis->embedded).edges;
      axis->max_edges = 0xc;
    }
LAB_00269d78:
    pAVar6 = axis->edges;
    pAVar11 = pAVar6 + uVar8;
    if ((int)uVar8 != 0) goto LAB_00269da6;
    FVar3 = 1;
    pAVar5 = pAVar11;
  }
  else {
    uVar1 = axis->max_edges;
    if (uVar1 <= axis->num_edges) {
      if (0x1745d16 < uVar1) {
        local_40 = 0x40;
LAB_00269e5d:
        pAVar5 = (AF_Edge_conflict)0x0;
        goto LAB_00269dee;
      }
      uVar4 = (uVar1 >> 2) + uVar1 + 4;
      local_3c = 0x1745d17;
      if (uVar4 < 0x1745d17) {
        local_3c = uVar4;
      }
      local_38 = (axis->embedded).edges;
      if (axis->edges == local_38) {
        pAVar5 = (AF_Edge_conflict)0x0;
        pAVar6 = (AF_Edge_conflict)
                 ft_mem_realloc(memory,0x58,0,(ulong)local_3c,(void *)0x0,&local_40);
        axis->edges = pAVar6;
        if (local_40 != 0) goto LAB_00269dee;
        memcpy(pAVar6,local_38,0x420);
      }
      else {
        pAVar5 = (AF_Edge_conflict)
                 ft_mem_realloc(memory,0x58,(ulong)uVar1,(ulong)local_3c,axis->edges,&local_40);
        axis->edges = pAVar5;
        if (local_40 != 0) goto LAB_00269e5d;
      }
      axis->max_edges = local_3c;
      uVar8 = (ulong)axis->num_edges;
      goto LAB_00269d78;
    }
    pAVar6 = axis->edges;
    pAVar11 = pAVar6 + uVar8;
LAB_00269da6:
    do {
      iVar7 = (int)pAVar11[-1].fpos;
      pAVar5 = pAVar11;
      if (top_to_bottom_hinting == '\0') {
        if (iVar7 < fpos) break;
      }
      else if (fpos < iVar7) break;
      if ((iVar7 == fpos) && (axis->major_dir == dir)) break;
      pAVar5 = pAVar11 + -1;
      pAVar10 = pAVar5;
      for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
        uVar2 = *(undefined6 *)&pAVar10->field_0x2;
        pAVar11->fpos = pAVar10->fpos;
        *(undefined6 *)&pAVar11->field_0x2 = uVar2;
        pAVar10 = (AF_Edge_conflict)((long)pAVar10 + (ulong)bVar12 * -0x10 + 8);
        pAVar11 = (AF_Edge_conflict)((long)pAVar11 + (ulong)bVar12 * -0x10 + 8);
      }
      pAVar11 = pAVar5;
    } while (pAVar6 < pAVar5);
    FVar3 = axis->num_edges + 1;
  }
  axis->num_edges = FVar3;
  local_40 = 0;
LAB_00269dee:
  *anedge = pAVar5;
  return local_40;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_axis_hints_new_edge( AF_AxisHints  axis,
                          FT_Int        fpos,
                          AF_Direction  dir,
                          FT_Bool       top_to_bottom_hinting,
                          FT_Memory     memory,
                          AF_Edge      *anedge )
  {
    FT_Error  error = FT_Err_Ok;
    AF_Edge   edge  = NULL;
    AF_Edge   edges;


    if ( axis->num_edges < AF_EDGES_EMBEDDED )
    {
      if ( !axis->edges )
      {
        axis->edges     = axis->embedded.edges;
        axis->max_edges = AF_EDGES_EMBEDDED;
      }
    }
    else if ( axis->num_edges >= axis->max_edges )
    {
      FT_UInt  old_max = axis->max_edges;
      FT_UInt  new_max = old_max;
      FT_UInt  big_max = FT_INT_MAX / sizeof ( *edge );


      if ( old_max >= big_max )
      {
        error = FT_THROW( Out_Of_Memory );
        goto Exit;
      }

      new_max += ( new_max >> 2 ) + 4;
      if ( new_max < old_max || new_max > big_max )
        new_max = big_max;

      if ( axis->edges == axis->embedded.edges )
      {
        if ( FT_NEW_ARRAY( axis->edges, new_max ) )
          goto Exit;
        ft_memcpy( axis->edges, axis->embedded.edges,
                   sizeof ( axis->embedded.edges ) );
      }
      else
      {
        if ( FT_RENEW_ARRAY( axis->edges, old_max, new_max ) )
          goto Exit;
      }

      axis->max_edges = new_max;
    }

    edges = axis->edges;
    edge  = edges + axis->num_edges;

    while ( edge > edges )
    {
      if ( top_to_bottom_hinting ? ( edge[-1].fpos > fpos )
                                 : ( edge[-1].fpos < fpos ) )
        break;

      /* we want the edge with same position and minor direction */
      /* to appear before those in the major one in the list     */
      if ( edge[-1].fpos == fpos && dir == axis->major_dir )
        break;

      edge[0] = edge[-1];
      edge--;
    }

    axis->num_edges++;

  Exit:
    *anedge = edge;
    return error;
  }